

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall
QPDF::processMemoryFile(QPDF *this,char *description,char *buf,size_t length,char *password)

{
  char *__s;
  BufferInputSource *this_00;
  Buffer *this_01;
  uchar *buf_00;
  allocator<char> local_61;
  string local_60;
  shared_ptr<InputSource> local_40;
  char *local_30;
  char *password_local;
  size_t length_local;
  char *buf_local;
  char *description_local;
  QPDF *this_local;
  
  local_30 = password;
  password_local = (char *)length;
  length_local = (size_t)buf;
  buf_local = description;
  description_local = (char *)this;
  this_00 = (BufferInputSource *)operator_new(0xe8);
  __s = buf_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  this_01 = (Buffer *)operator_new(8);
  buf_00 = QUtil::unsigned_char_pointer((char *)length_local);
  Buffer::Buffer(this_01,buf_00,(size_t)password_local);
  BufferInputSource::BufferInputSource(this_00,&local_60,this_01,true);
  std::shared_ptr<InputSource>::shared_ptr<BufferInputSource,void>(&local_40,this_00);
  processInputSource(this,&local_40,local_30);
  std::shared_ptr<InputSource>::~shared_ptr(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

void
QPDF::processMemoryFile(
    char const* description, char const* buf, size_t length, char const* password)
{
    processInputSource(
        std::shared_ptr<InputSource>(
            // line-break
            new BufferInputSource(
                description, new Buffer(QUtil::unsigned_char_pointer(buf), length), true)),
        password);
}